

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O3

bool __thiscall libebml::EbmlElement::ForceSize(EbmlElement *this,uint64 NewSize)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (this->bSizeIsFinite == false) {
    uVar1 = this->Size;
    uVar2 = this->SizeLength;
    uVar3 = 1;
    uVar4 = 1;
    if (((0x7f < uVar1) && (uVar4 = 2, 0x3fff < uVar1)) && (uVar4 = 3, 0x1fffff < uVar1)) {
      uVar4 = 5 - (uVar1 < 0x10000000);
    }
    if (uVar4 <= uVar2) {
      uVar4 = uVar2;
    }
    this->Size = NewSize;
    if (((0x7f < NewSize) && (uVar3 = 2, 0x3fff < NewSize)) && (uVar3 = 3, 0x1fffff < NewSize)) {
      uVar3 = 5 - (NewSize < 0x10000000);
    }
    if (uVar2 < uVar3) {
      uVar2 = uVar3;
    }
    if (uVar2 == uVar4) {
      this->bSizeIsFinite = true;
      return true;
    }
    this->Size = uVar1;
  }
  return false;
}

Assistant:

bool EbmlElement::ForceSize(uint64 NewSize)
{
  if (bSizeIsFinite) {
    return false;
  }

  int OldSizeLen = CodedSizeLength(Size, SizeLength, bSizeIsFinite);
  uint64 OldSize = Size;

  Size = NewSize;

  if (CodedSizeLength(Size, SizeLength, bSizeIsFinite) == OldSizeLen) {
    bSizeIsFinite = true;
    return true;
  }
  Size = OldSize;

  return false;
}